

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O0

void __thiscall Nes_Square::run(Nes_Square *this,cpu_time_t time,cpu_time_t end_time)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long in_RDX;
  long in_RSI;
  Nes_Envelope *in_RDI;
  int phase;
  int delta_1;
  Synth *synth;
  Blip_Buffer *output;
  int delta;
  int amp;
  int duty;
  int duty_select;
  int count;
  int timer_period;
  int offset;
  int period;
  int volume;
  Blip_Buffer *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  Blip_Synth<3,_15> *in_stack_ffffffffffffffb0;
  Blip_Synth<3,_15> *this_00;
  uint local_38;
  uint local_34;
  int local_24;
  long local_10;
  
  if ((in_RDI->super_Nes_Osc).output != (Blip_Buffer *)0x0) {
    uVar1 = Nes_Envelope::volume(in_RDI);
    iVar2 = Nes_Osc::period(&in_RDI->super_Nes_Osc);
    local_24 = iVar2 >> ((in_RDI->super_Nes_Osc).regs[1] & 7);
    if (((in_RDI->super_Nes_Osc).regs[1] & 8) != 0) {
      local_24 = 0;
    }
    iVar3 = (iVar2 + 1) * 2;
    if (((uVar1 == 0) || (iVar2 < 8)) || (0x7ff < iVar2 + local_24)) {
      if ((in_RDI->super_Nes_Osc).last_amp != 0) {
        Blip_Synth<3,_15>::offset
                  (in_stack_ffffffffffffffb0,
                   CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff98);
        (in_RDI->super_Nes_Osc).last_amp = 0;
      }
      local_10 = (in_RDI->super_Nes_Osc).delay + in_RSI;
      if (local_10 < in_RDX) {
        iVar2 = (int)(((in_RDX - local_10) + (long)iVar3 + -1) / (long)iVar3);
        *(uint *)in_RDI[1].super_Nes_Osc.regs = *(int *)in_RDI[1].super_Nes_Osc.regs + iVar2 & 7;
        local_10 = (long)iVar2 * (long)iVar3 + local_10;
      }
    }
    else {
      iVar2 = (int)(uint)(in_RDI->super_Nes_Osc).regs[0] >> 6;
      local_34 = 1 << (sbyte)iVar2;
      local_38 = 0;
      if (iVar2 == 3) {
        local_34 = 2;
        local_38 = uVar1;
      }
      if (*(int *)in_RDI[1].super_Nes_Osc.regs < (int)local_34) {
        local_38 = uVar1 ^ local_38;
      }
      iVar2 = Nes_Osc::update_amp(&in_RDI->super_Nes_Osc,local_38);
      if (iVar2 != 0) {
        Blip_Synth<3,_15>::offset
                  (in_stack_ffffffffffffffb0,
                   CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff98);
      }
      local_10 = (in_RDI->super_Nes_Osc).delay + in_RSI;
      if (local_10 < in_RDX) {
        this_00 = (Blip_Synth<3,_15> *)in_RDI[1].super_Nes_Osc.output;
        iVar2 = local_38 * 2 - uVar1;
        uVar5 = *(uint *)in_RDI[1].super_Nes_Osc.regs;
        do {
          uVar4 = uVar5 + 1;
          uVar5 = uVar4 & 7;
          if ((uVar5 == 0) || (uVar5 == local_34)) {
            iVar2 = -iVar2;
            Blip_Synth<3,_15>::offset_inline
                      (this_00,CONCAT44(iVar2,uVar4) & 0xffffffff00000007,
                       (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff98);
          }
          local_10 = iVar3 + local_10;
        } while (local_10 < in_RDX);
        (in_RDI->super_Nes_Osc).last_amp = (int)(iVar2 + uVar1) >> 1;
        *(uint *)in_RDI[1].super_Nes_Osc.regs = uVar5;
      }
    }
    (in_RDI->super_Nes_Osc).delay = (int)local_10 - (int)in_RDX;
  }
  return;
}

Assistant:

void Nes_Square::run( cpu_time_t time, cpu_time_t end_time )
{
	if ( !output )
		return;
	
	const int volume = this->volume();
	const int period = this->period();
	int offset = period >> (regs [1] & shift_mask);
	if ( regs [1] & negate_flag )
		offset = 0;
	
	const int timer_period = (period + 1) * 2;
	if ( volume == 0 || period < 8 || (period + offset) >= 0x800 )
	{
		if ( last_amp ) {
			synth->offset( time, -last_amp, output );
			last_amp = 0;
		}
		
		time += delay;
		if ( time < end_time )
		{
			// maintain proper phase
			int count = (end_time - time + timer_period - 1) / timer_period;
			phase = (phase + count) & (phase_range - 1);
			time += (long) count * timer_period;
		}
	}
	else
	{
		// handle duty select
		int duty_select = (regs [0] >> 6) & 3;
		int duty = 1 << duty_select; // 1, 2, 4, 2
		int amp = 0;
		if ( duty_select == 3 ) {
			duty = 2; // negated 25%
			amp = volume;
		}
		if ( phase < duty )
			amp ^= volume;
		
		int delta = update_amp( amp );
		if ( delta )
			synth->offset( time, delta, output );
		
		time += delay;
		if ( time < end_time )
		{
			Blip_Buffer* const output = this->output;
			const Synth* synth = this->synth;
			int delta = amp * 2 - volume;
			int phase = this->phase;
			
			do {
				phase = (phase + 1) & (phase_range - 1);
				if ( phase == 0 || phase == duty ) {
					delta = -delta;
					synth->offset_inline( time, delta, output );
				}
				time += timer_period;
			}
			while ( time < end_time );
			
			last_amp = (delta + volume) >> 1;
			this->phase = phase;
		}
	}
	
	delay = time - end_time;
}